

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa.hpp
# Opt level: O3

string_view __thiscall mg::data::MappedHfa::entry_data(MappedHfa *this,int index)

{
  pointer pPVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  string_view sVar5;
  
  uVar3 = (ulong)index;
  pPVar1 = (this->_entries).
           super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->_entries).
                super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1;
  if (uVar3 < (ulong)(lVar2 >> 7)) {
    sVar5._M_len = (ulong)pPVar1[uVar3].size;
    sVar5._M_str = ((this->_backing_data).
                    super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _data + (ulong)pPVar1[uVar3].offset + lVar2 + 0x10;
    return sVar5;
  }
  pcVar4 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  *(long **)pcVar4 = (long *)((long)pcVar4 + 0x10);
  std::__cxx11::string::_M_construct<char*>();
  sVar5 = (string_view)
          std::filesystem::__cxx11::path::_List::_List
                    ((_List *)((long)pcVar4 + 0x20),(_List *)(uVar3 + 0x20));
  return sVar5;
}

Assistant:

const std::string_view entry_data(int index) const {
    const auto &entry = _entries.at(index);
    const size_t header_size_bytes =
        sizeof(Hfa::FileHeader) +
        sizeof(Hfa::PackedEntryHeader) * _entries.size();
    const size_t offset_bytes = header_size_bytes + entry.offset;
    return std::string_view(
        reinterpret_cast<const char *>(_backing_data->data()) + offset_bytes,
        entry.size);
  }